

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fctstr_eq(char *s1,char *s2)

{
  int iVar1;
  long lVar2;
  
  iVar1 = 1;
  if (s1 != s2) {
    for (lVar2 = 0; s1[lVar2] == s2[lVar2]; lVar2 = lVar2 + 1) {
      if (s1[lVar2] == '\0') {
        return 1;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
fctstr_eq(char const *s1, char const *s2)
{
    if ( s1 == s2 )
    {
        return 1;
    }
    if ( (s1 == NULL && s2 != NULL)
            || (s1 != NULL && s2 == NULL) )
    {
        return 0;
    }
    while (*s1 == *s2)
    {
        if (*s1 == '\0')
            return 1;
        s1++;
        s2++;
    }
    /* Difference detected! */
    return 0;
}